

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

void la_miam_core_format_text(la_vstring *vstr,void *data,int indent)

{
  la_miam_core_pdu *pdu;
  
  if (*data != 0) {
    la_miam_errors_format_text(vstr,(uint)*data,indent);
    return;
  }
  la_vstring_append_sprintf
            (vstr,"%*sMIAM CORE %s, version %u:\n",indent,"",
             la_miam_core_format_text_la_miam_core_pdu_type_names_rel +
             *(int *)(la_miam_core_format_text_la_miam_core_pdu_type_names_rel +
                     (ulong)*(uint *)((long)data + 8) * 4),(ulong)*(byte *)((long)data + 4));
  return;
}

Assistant:

void la_miam_core_format_text(la_vstring *vstr, void const *data, int indent) {
	static char const *la_miam_core_pdu_type_names[] = {
		[LA_MIAM_CORE_PDU_DATA] = "Data",
		[LA_MIAM_CORE_PDU_ACK] = "Ack",
		[LA_MIAM_CORE_PDU_ALO] = "Aloha",
		[LA_MIAM_CORE_PDU_ALR] = "Aloha Reply",
		[LA_MIAM_CORE_PDU_UNKNOWN] = "unknown PDU"
	};

	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_core_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	la_assert(pdu->pdu_type <= LA_MIAM_CORE_PDU_TYPE_MAX);
	LA_ISPRINTF(vstr, indent, "MIAM CORE %s, version %u:\n",
			la_miam_core_pdu_type_names[pdu->pdu_type], pdu->version);
	indent++;
}